

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O2

void __thiscall psy::C::SemanticModelTester::case0400(SemanticModelTester *this)

{
  bool bVar1;
  TagDeclarationSymbol *this_00;
  TagType *pTVar2;
  Lexeme *pLVar3;
  undefined8 uVar4;
  ostream *poVar5;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [48];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"enum x { y } ;",&local_69)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_48 + 0x10),"",&local_6a);
  compile<psy::C::EnumDeclarationSyntax>((SemanticModelTester *)local_48,(string *)this,&local_68);
  std::__cxx11::string::~string((string *)(local_48 + 0x10));
  std::__cxx11::string::~string((string *)&local_68);
  this_00 = &SemanticModel::enumFor
                       ((SemanticModel *)local_48._0_8_,(EnumDeclarationSyntax *)local_48._8_8_)->
             super_TagDeclarationSymbol;
  if (this_00 == (TagDeclarationSymbol *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar5 = std::operator<<(poVar5,"\t\tExpression is NOT ");
    poVar5 = std::operator<<(poVar5,"true");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x2e3);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    pTVar2 = TagDeclarationSymbol::introducedNewType(this_00);
    pLVar3 = &TagType::tag(pTVar2)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_68,pLVar3);
    bVar1 = std::operator==(&local_68,"x");
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      return;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar5 = std::operator<<(poVar5,"\t\tActual  : ");
    pTVar2 = TagDeclarationSymbol::introducedNewType(this_00);
    pLVar3 = &TagType::tag(pTVar2)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_68,pLVar3);
    poVar5 = std::operator<<(poVar5,(string *)&local_68);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"\t\tExpected: ");
    poVar5 = std::operator<<(poVar5,"x");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x2e4);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_68);
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&TestFailed::typeinfo,0);
}

Assistant:

void SemanticModelTester::case0400()
{
    auto [enumDeclNode, semaModel] =
            compile<EnumDeclarationSyntax>("enum x { y } ;");

    const EnumDeclarationSymbol* enun = semaModel->enumFor(enumDeclNode);
    PSY_EXPECT_TRUE(enun);
    PSY_EXPECT_EQ_STR(enun->introducedNewType()->tag()->valueText(), "x");
}